

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O0

int arkStep_SetButcherTables(ARKodeMem ark_mem)

{
  int iVar1;
  ARKodeButcherTable pAVar2;
  ulong uVar3;
  ARKodeMem in_RDI;
  sunindextype Bliw;
  sunindextype Blrw;
  ARKodeARKStepMem step_mem;
  int itable;
  int etable;
  undefined8 in_stack_ffffffffffffffc8;
  ARKODE_DIRKTableID imethod;
  int local_28;
  int local_24;
  void *local_20;
  int local_18;
  int local_14;
  ARKodeMem local_10;
  int local_4;
  
  imethod = (ARKODE_DIRKTableID)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  if (in_RDI->step_mem == (void *)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode::ARKStep","arkStep_SetButcherTables",
                    "Time step module memory is NULL.");
    local_4 = -0x15;
  }
  else {
    local_20 = in_RDI->step_mem;
    if ((*(long *)((long)local_20 + 0x60) == 0) && (*(long *)((long)local_20 + 0x68) == 0)) {
      local_18 = -1;
      local_14 = -1;
      local_10 = in_RDI;
      if ((*(int *)((long)local_20 + 0x18) == 0) || (*(int *)((long)local_20 + 0x1c) == 0)) {
        if (*(int *)((long)local_20 + 0x1c) == 0) {
          switch(*(undefined4 *)((long)local_20 + 0x50)) {
          case 2:
            local_14 = 0;
            break;
          case 3:
            local_14 = 1;
            break;
          case 4:
            local_14 = 3;
            break;
          case 5:
            local_14 = 6;
            break;
          case 6:
            local_14 = 10;
            break;
          case 7:
          case 8:
            local_14 = 0xb;
            break;
          default:
            arkProcessError(in_RDI,-0x16,"ARKode::ARKStep","arkStep_SetButcherTables",
                            "No explicit method at requested order, using q=6.");
            local_14 = 10;
          }
        }
        else {
          uVar3 = (ulong)(*(int *)((long)local_20 + 0x50) - 2);
          switch(uVar3) {
          case 0:
            local_18 = 100;
            break;
          case 1:
            local_18 = 0x68;
            break;
          case 2:
            local_18 = 0x6b;
            break;
          case 3:
            local_18 = 0x6f;
            break;
          default:
            arkProcessError(in_RDI,-0x16,"ARKode::ARKStep","arkStep_SetButcherTables",
                            "No implicit method at requested order, using q=5.");
            local_18 = 0x6f;
          }
          imethod = (ARKODE_DIRKTableID)(uVar3 >> 0x20);
        }
      }
      else {
        iVar1 = *(int *)((long)local_20 + 0x50);
        if (iVar1 - 2U < 2) {
          local_14 = 2;
          local_18 = 0x68;
        }
        else if (iVar1 == 4) {
          local_14 = 4;
          local_18 = 0x6d;
        }
        else if (iVar1 == 5) {
          local_14 = 9;
          local_18 = 0x6f;
        }
        else {
          arkProcessError(in_RDI,-0x16,"ARKode::ARKStep","arkStep_SetButcherTables",
                          "No ImEx method at requested order, using q=5.");
          local_14 = 9;
          local_18 = 0x6f;
        }
      }
      if (-1 < local_14) {
        pAVar2 = ARKodeButcherTable_LoadERK(imethod);
        *(ARKodeButcherTable *)((long)local_20 + 0x60) = pAVar2;
      }
      if (-1 < local_18) {
        pAVar2 = ARKodeButcherTable_LoadDIRK(imethod);
        *(ARKodeButcherTable *)((long)local_20 + 0x68) = pAVar2;
      }
      ARKodeButcherTable_Space(*(ARKodeButcherTable *)((long)local_20 + 0x60),&local_28,&local_24);
      local_10->liw = (long)local_28 + local_10->liw;
      local_10->lrw = (long)local_24 + local_10->lrw;
      ARKodeButcherTable_Space(*(ARKodeButcherTable *)((long)local_20 + 0x68),&local_28,&local_24);
      local_10->liw = (long)local_28 + local_10->liw;
      local_10->lrw = (long)local_24 + local_10->lrw;
      if (*(long *)((long)local_20 + 0x60) != 0) {
        *(undefined4 *)((long)local_20 + 0x5c) =
             *(undefined4 *)(*(long *)((long)local_20 + 0x60) + 8);
        *(undefined4 *)((long)local_20 + 0x50) = **(undefined4 **)((long)local_20 + 0x60);
        *(undefined4 *)((long)local_20 + 0x54) =
             *(undefined4 *)(*(long *)((long)local_20 + 0x60) + 4);
      }
      if (*(long *)((long)local_20 + 0x68) != 0) {
        *(undefined4 *)((long)local_20 + 0x5c) =
             *(undefined4 *)(*(long *)((long)local_20 + 0x68) + 8);
        *(undefined4 *)((long)local_20 + 0x50) = **(undefined4 **)((long)local_20 + 0x68);
        *(undefined4 *)((long)local_20 + 0x54) =
             *(undefined4 *)(*(long *)((long)local_20 + 0x68) + 4);
      }
      local_4 = 0;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int arkStep_SetButcherTables(ARKodeMem ark_mem)
{
  int etable, itable;
  ARKodeARKStepMem step_mem;
  sunindextype Blrw, Bliw;

  /* access ARKodeARKStepMem structure */
  if (ark_mem->step_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode::ARKStep",
                    "arkStep_SetButcherTables", MSG_ARKSTEP_NO_MEM);
    return(ARK_MEM_NULL);
  }
  step_mem = (ARKodeARKStepMem) ark_mem->step_mem;

  /* if tables have already been specified, just return */
  if ( (step_mem->Be != NULL) || (step_mem->Bi != NULL) )
    return(ARK_SUCCESS);

  /* initialize table numbers to illegal values */
  etable = itable = -1;

  /**** ImEx methods ****/
  if (step_mem->explicit && step_mem->implicit) {

    switch (step_mem->q) {

    case(2):
    case(3):
      etable = ARKSTEP_DEFAULT_ARK_ETABLE_3;
      itable = ARKSTEP_DEFAULT_ARK_ITABLE_3;
      break;
    case(4):
      etable = ARKSTEP_DEFAULT_ARK_ETABLE_4;
      itable = ARKSTEP_DEFAULT_ARK_ITABLE_4;
      break;
    case(5):
      etable = ARKSTEP_DEFAULT_ARK_ETABLE_5;
      itable = ARKSTEP_DEFAULT_ARK_ITABLE_5;
      break;
    default:    /* no available method, set default */
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                      "arkStep_SetButcherTables",
                      "No ImEx method at requested order, using q=5.");
      etable = ARKSTEP_DEFAULT_ARK_ETABLE_5;
      itable = ARKSTEP_DEFAULT_ARK_ITABLE_5;
      break;
    }

  /**** implicit methods ****/
  } else if (step_mem->implicit) {

    switch (step_mem->q) {
    case(2):
      itable = ARKSTEP_DEFAULT_DIRK_2;
      break;
    case(3):
      itable = ARKSTEP_DEFAULT_DIRK_3;
      break;
    case(4):
      itable = ARKSTEP_DEFAULT_DIRK_4;
      break;
    case(5):
      itable = ARKSTEP_DEFAULT_DIRK_5;
      break;
    default:    /* no available method, set default */
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                      "arkStep_SetButcherTables",
                      "No implicit method at requested order, using q=5.");
      itable = ARKSTEP_DEFAULT_DIRK_5;
      break;
    }

  /**** explicit methods ****/
  } else {

    switch (step_mem->q) {
    case(2):
      etable = ARKSTEP_DEFAULT_ERK_2;
      break;
    case(3):
      etable = ARKSTEP_DEFAULT_ERK_3;
      break;
    case(4):
      etable = ARKSTEP_DEFAULT_ERK_4;
      break;
    case(5):
      etable = ARKSTEP_DEFAULT_ERK_5;
      break;
    case(6):
      etable = ARKSTEP_DEFAULT_ERK_6;
      break;
    case(7):
    case(8):
      etable = ARKSTEP_DEFAULT_ERK_8;
      break;
    default:    /* no available method, set default */
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                      "arkStep_SetButcherTables",
                      "No explicit method at requested order, using q=6.");
      etable = ARKSTEP_DEFAULT_ERK_6;
      break;
    }

  }

  if (etable > -1)
    step_mem->Be = ARKodeButcherTable_LoadERK(etable);
  if (itable > -1)
    step_mem->Bi = ARKodeButcherTable_LoadDIRK(itable);

  /* note Butcher table space requirements */
  ARKodeButcherTable_Space(step_mem->Be, &Bliw, &Blrw);
  ark_mem->liw += Bliw;
  ark_mem->lrw += Blrw;

  ARKodeButcherTable_Space(step_mem->Bi, &Bliw, &Blrw);
  ark_mem->liw += Bliw;
  ark_mem->lrw += Blrw;

  /* set [redundant] ARK stored values for stage numbers and method orders */
  if (step_mem->Be != NULL) {
    step_mem->stages = step_mem->Be->stages;
    step_mem->q = step_mem->Be->q;
    step_mem->p = step_mem->Be->p;
  }
  if (step_mem->Bi != NULL) {
    step_mem->stages = step_mem->Bi->stages;
    step_mem->q = step_mem->Bi->q;
    step_mem->p = step_mem->Bi->p;
  }

  return(ARK_SUCCESS);
}